

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

void ReportOnFunctionSelectError
               (ExpressionContext *ctx,SynBase *source,char *errorBuf,uint errorBufSize,
               char *messageStart,InplaceStr functionName,ArrayView<FunctionValue> functions,
               IntrusiveList<TypeHandle> generics,ArrayView<ArgumentData> arguments,
               ArrayView<unsigned_int> ratings,uint bestRating,bool showInstanceInfo)

{
  FunctionData *function;
  TypeBase *pTVar1;
  char *pcVar2;
  ArgumentData *pAVar3;
  long lVar4;
  undefined8 uVar5;
  TypeStruct *pTVar6;
  Allocator *pAVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  bool bVar10;
  int iVar11;
  MatchData *pMVar12;
  TypeFunction *instance;
  size_t sVar13;
  uint uVar14;
  char *pcVar15;
  uint k;
  uint index;
  char *pcVar16;
  ScopeData *parentType;
  ulong uVar17;
  size_t size;
  ExpressionContext *this;
  char *pcVar18;
  TypeHandle *pTVar19;
  ExpressionContext *pEVar20;
  ulong uVar21;
  int iVar22;
  IntrusiveList<TypeHandle> *pIVar23;
  long lVar24;
  ArrayView<ArgumentData> functionArguments;
  ArrayView<ArgumentData> arguments_00;
  ArrayView<CallArgumentData> arguments_01;
  ArrayView<CallArgumentData> arguments_02;
  IntrusiveList<MatchData> aliases;
  SmallArray<CallArgumentData,_16U> result;
  IntrusiveList<MatchData> local_168;
  char *local_158;
  FunctionValue *local_150;
  SmallArray<CallArgumentData,_16U> local_148;
  
  local_158 = messageStart;
  if (errorBuf == (char *)0x0) {
    __assert_fail("errorBuf",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x192e,
                  "void ReportOnFunctionSelectError(ExpressionContext &, SynBase *, char *, unsigned int, const char *, InplaceStr, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, ArrayView<unsigned int>, unsigned int, bool)"
                 );
  }
  iVar22 = (int)errorBuf;
  if (functionName.begin != functionName.end) {
    iVar11 = NULLC::SafeSprintf(errorBuf,(ulong)errorBufSize,"  %.*s",
                                (ulong)(uint)((int)functionName.end - (int)functionName.begin));
    pcVar16 = errorBuf + iVar11;
    size = (size_t)(errorBufSize - iVar11);
    if (generics.head == (TypeHandle *)0x0) {
      pcVar15 = "(";
    }
    else {
      iVar11 = NULLC::SafeSprintf(pcVar16,size,"<");
      pcVar16 = pcVar16 + iVar11;
      pTVar19 = generics.head;
      do {
        pcVar15 = ", ";
        if (pTVar19 == generics.head) {
          pcVar15 = "";
        }
        iVar11 = NULLC::SafeSprintf(pcVar16,(ulong)((iVar22 - (int)pcVar16) + errorBufSize),"%s%.*s"
                                    ,pcVar15);
        pcVar16 = pcVar16 + iVar11;
        pTVar19 = pTVar19->next;
      } while (pTVar19 != (TypeHandle *)0x0);
      size = (size_t)((iVar22 - (int)pcVar16) + errorBufSize);
      pcVar15 = ">(";
    }
    iVar11 = NULLC::SafeSprintf(pcVar16,size,pcVar15);
    pcVar16 = pcVar16 + iVar11;
    if (arguments.count != 0) {
      lVar24 = 0;
      uVar17 = 0;
      do {
        pcVar15 = ", ";
        if (lVar24 == 0) {
          pcVar15 = "";
        }
        iVar11 = NULLC::SafeSprintf(pcVar16,(ulong)((iVar22 - (int)pcVar16) + errorBufSize),"%s%.*s"
                                    ,pcVar15);
        pcVar16 = pcVar16 + iVar11;
        uVar17 = uVar17 + 1;
        lVar24 = lVar24 + 0x30;
      } while (uVar17 < arguments.count);
    }
    pcVar15 = ")\n";
    if (functions.count == 0) {
      pcVar15 = ")";
    }
    iVar11 = NULLC::SafeSprintf(pcVar16,(ulong)((iVar22 - (int)pcVar16) + errorBufSize),pcVar15);
    errorBuf = pcVar16 + iVar11;
  }
  if (functions.count != 0) {
    pcVar16 = " candidates are:\n";
    if (bestRating == 0xffffffff) {
      pcVar16 = " the only available are:\n";
    }
    iVar11 = NULLC::SafeSprintf(errorBuf,(ulong)((iVar22 - (int)errorBuf) + errorBufSize),pcVar16);
    if (functions.count != 0) {
      pcVar16 = errorBuf + iVar11;
      uVar17 = 0;
      do {
        function = functions.data[uVar17].function;
        if ((ulong)ratings.count == 0) {
LAB_001edd69:
          pTVar1 = function->type->returnType;
          pcVar15 = (pTVar1->name).begin;
          pcVar18 = (function->name->name).begin;
          iVar11 = NULLC::SafeSprintf(pcVar16,(ulong)((iVar22 - (int)pcVar16) + errorBufSize),
                                      "  %.*s %.*s",
                                      (ulong)(uint)(*(int *)&(pTVar1->name).end - (int)pcVar15),
                                      pcVar15,(ulong)(uint)(*(int *)&(function->name->name).end -
                                                           (int)pcVar18),pcVar18);
          pEVar20 = (ExpressionContext *)(pcVar16 + iVar11);
          if ((function->generics).head != (MatchData *)0x0) {
            index = 0;
            iVar11 = NULLC::SafeSprintf((char *)pEVar20,
                                        (ulong)((iVar22 - (int)pEVar20) + errorBufSize),"<");
            pcVar16 = (char *)((long)(pEVar20->uniqueDependencies).little + (long)iVar11 + -0x30);
            while( true ) {
              pMVar12 = (function->generics).head;
              uVar14 = 0;
              if (pMVar12 != (MatchData *)0x0) {
                uVar14 = 0;
                do {
                  uVar14 = uVar14 + 1;
                  pMVar12 = pMVar12->next;
                } while (pMVar12 != (MatchData *)0x0);
              }
              if (uVar14 <= index) break;
              pMVar12 = IntrusiveList<MatchData>::operator[](&function->generics,index);
              pcVar15 = ", ";
              if (index == 0) {
                pcVar15 = "";
              }
              pcVar2 = (pMVar12->type->name).begin;
              iVar11 = NULLC::SafeSprintf(pcVar16,(ulong)((iVar22 - (int)pcVar16) + errorBufSize),
                                          "%s%.*s",pcVar15,
                                          (ulong)(uint)(*(int *)&(pMVar12->type->name).end -
                                                       (int)pcVar2),pcVar2,pcVar18);
              pcVar16 = pcVar16 + iVar11;
              index = index + 1;
            }
            iVar11 = NULLC::SafeSprintf(pcVar16,(ulong)((iVar22 - (int)pcVar16) + errorBufSize),">")
            ;
            pEVar20 = (ExpressionContext *)(pcVar16 + iVar11);
          }
          this = pEVar20;
          iVar11 = NULLC::SafeSprintf((char *)pEVar20,
                                      (ulong)((iVar22 - (int)pEVar20) + errorBufSize),"(");
          pEVar20 = (ExpressionContext *)
                    ((long)(pEVar20->uniqueDependencies).little + (long)iVar11 + -0x30);
          if ((function->arguments).count != 0) {
            lVar24 = 0;
            uVar21 = 0;
            do {
              pAVar3 = (function->arguments).data;
              pcVar16 = ", ";
              if (lVar24 == 0) {
                pcVar16 = "";
              }
              pcVar15 = "";
              if ((&pAVar3->isExplicit)[lVar24] != false) {
                pcVar15 = "explicit ";
              }
              lVar4 = *(long *)((long)&pAVar3->type + lVar24);
              uVar5 = *(undefined8 *)(lVar4 + 0x10);
              this = pEVar20;
              iVar11 = NULLC::SafeSprintf((char *)pEVar20,
                                          (ulong)((iVar22 - (int)pEVar20) + errorBufSize),"%s%s%.*s"
                                          ,pcVar16,pcVar15,
                                          (ulong)(uint)(*(int *)(lVar4 + 0x18) - (int)uVar5),uVar5);
              pEVar20 = (ExpressionContext *)
                        ((long)(pEVar20->uniqueDependencies).little + (long)iVar11 + -0x30);
              uVar21 = uVar21 + 1;
              lVar24 = lVar24 + 0x30;
            } while (uVar21 < (function->arguments).count);
          }
          bVar10 = ExpressionContext::IsGenericFunction(this,function);
          iVar11 = (int)pEVar20;
          if (showInstanceInfo && bVar10) {
            if (functions.count <= uVar17) {
              pcVar16 = "T &ArrayView<FunctionValue>::operator[](unsigned int) [T = FunctionValue]";
LAB_001ee3d7:
              __assert_fail("index < count",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                            ,0x22a,pcVar16);
            }
            local_150 = functions.data;
            pTVar6 = (TypeStruct *)(functions.data[uVar17].context)->type;
            parentType = (ScopeData *)function->scope->ownerType;
            if (pTVar6 == ctx->typeAutoRef) {
              if (parentType == (ScopeData *)0x0) {
                __assert_fail("function->scope->ownerType",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                              ,0x1975,
                              "void ReportOnFunctionSelectError(ExpressionContext &, SynBase *, char *, unsigned int, const char *, InplaceStr, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, ArrayView<unsigned int>, unsigned int, bool)"
                             );
              }
            }
            else if (parentType == (ScopeData *)0x0) {
              parentType = (ScopeData *)0x0;
            }
            else {
              parentType = pTVar6->typeScope;
            }
            local_168.head = (MatchData *)0x0;
            local_168.tail = (MatchData *)0x0;
            pAVar7 = ctx->allocator;
            memset(local_148.little,0,0x100);
            local_148.count = 0;
            local_148.max = 0x10;
            uVar8 = (function->arguments).data;
            uVar9 = (function->arguments).count;
            functionArguments.count = uVar9;
            functionArguments.data = (ArgumentData *)uVar8;
            functionArguments._12_4_ = 0;
            arguments_00._12_4_ = 0;
            arguments_00.data = (ArgumentData *)SUB128(arguments._0_12_,0);
            arguments_00.count = SUB124(arguments._0_12_,8);
            local_148.data = local_148.little;
            local_148.allocator = pAVar7;
            bVar10 = PrepareArgumentsForFunctionCall
                               (ctx,source,functionArguments,arguments_00,&local_148,(uint *)0x0,
                                false);
            if ((bVar10) &&
               (((TypeStruct *)(local_150[uVar17].context)->type != ctx->typeAutoRef ||
                (generics.head == (TypeHandle *)0x0)))) {
              arguments_01.count = local_148.count;
              arguments_01.data = local_148.data;
              arguments_01._12_4_ = 0;
              instance = GetGenericFunctionInstanceType
                                   (ctx,source,(TypeBase *)parentType,function,arguments_01,
                                    &local_168);
              if (instance == (TypeFunction *)0x0) {
                iVar11 = NULLC::SafeSprintf((char *)pEVar20,
                                            (ulong)((iVar22 - iVar11) + errorBufSize),
                                            ") (wasn\'t instanced here)");
              }
              else {
                arguments_02.count = local_148.count;
                arguments_02.data = local_148.data;
                arguments_02._12_4_ = 0;
                GetFunctionRating(ctx,function,instance,arguments_02);
                pTVar1 = function->type->returnType;
                pcVar16 = (pTVar1->name).begin;
                pcVar15 = (function->name->name).begin;
                iVar11 = NULLC::SafeSprintf((char *)pEVar20,
                                            (ulong)((iVar22 - iVar11) + errorBufSize),
                                            ") instanced to\n    %.*s %.*s(",
                                            (ulong)(uint)(*(int *)&(pTVar1->name).end - (int)pcVar16
                                                         ),pcVar16,
                                            (ulong)(uint)(*(int *)&(function->name->name).end -
                                                         (int)pcVar15),pcVar15);
                pEVar20 = (ExpressionContext *)
                          ((long)(pEVar20->uniqueDependencies).little + (long)iVar11 + -0x30);
                if ((function->arguments).count != 0) {
                  pIVar23 = &instance->arguments;
                  lVar24 = 0;
                  uVar21 = 0;
                  do {
                    pcVar16 = ", ";
                    pcVar18 = "";
                    if (lVar24 == 0) {
                      pcVar16 = "";
                    }
                    pTVar19 = pIVar23->head;
                    if ((&((function->arguments).data)->isExplicit)[lVar24] != false) {
                      pcVar18 = "explicit ";
                    }
                    pTVar1 = pTVar19->type;
                    pcVar15 = (pTVar1->name).begin;
                    iVar11 = NULLC::SafeSprintf((char *)pEVar20,
                                                (ulong)((iVar22 - (int)pEVar20) + errorBufSize),
                                                "%s%s%.*s",pcVar16,pcVar18,
                                                (ulong)(uint)(*(int *)&(pTVar1->name).end -
                                                             (int)pcVar15),pcVar15);
                    pEVar20 = (ExpressionContext *)
                              ((long)(pEVar20->uniqueDependencies).little + (long)iVar11 + -0x30);
                    pIVar23 = (IntrusiveList<TypeHandle> *)&pTVar19->next;
                    uVar21 = uVar21 + 1;
                    lVar24 = lVar24 + 0x30;
                  } while (uVar21 < (function->arguments).count);
                }
                uVar21 = (ulong)((iVar22 - (int)pEVar20) + errorBufSize);
                if (local_168.head == (MatchData *)0x0) {
                  iVar11 = NULLC::SafeSprintf((char *)pEVar20,uVar21,")");
                }
                else {
                  iVar11 = NULLC::SafeSprintf((char *)pEVar20,uVar21,") with [");
                  pEVar20 = (ExpressionContext *)
                            ((long)(pEVar20->uniqueDependencies).little + (long)iVar11 + -0x30);
                  for (pMVar12 = local_168.head;
                      uVar21 = (ulong)((iVar22 - (int)pEVar20) + errorBufSize),
                      pMVar12 != (MatchData *)0x0; pMVar12 = pMVar12->next) {
                    pcVar16 = ", ";
                    if (pMVar12 == local_168.head) {
                      pcVar16 = "";
                    }
                    pcVar18 = (pMVar12->name->name).begin;
                    pcVar2 = (pMVar12->type->name).begin;
                    pcVar15 = (char *)CONCAT44((int)((ulong)pcVar15 >> 0x20),
                                               *(int *)&(pMVar12->type->name).end - (int)pcVar2);
                    iVar11 = NULLC::SafeSprintf((char *)pEVar20,uVar21,"%s%.*s = %.*s",pcVar16,
                                                (ulong)(uint)(*(int *)&(pMVar12->name->name).end -
                                                             (int)pcVar18),pcVar18,pcVar15,pcVar2);
                    pEVar20 = (ExpressionContext *)
                              ((long)(pEVar20->uniqueDependencies).little + (long)iVar11 + -0x30);
                  }
                  iVar11 = NULLC::SafeSprintf((char *)pEVar20,uVar21,"]");
                }
              }
            }
            else {
              iVar11 = NULLC::SafeSprintf((char *)pEVar20,(ulong)((iVar22 - iVar11) + errorBufSize),
                                          ") (wasn\'t instanced here)");
            }
            pcVar16 = (char *)((long)(pEVar20->uniqueDependencies).little + (long)iVar11 + -0x30);
            SmallArray<CallArgumentData,_16U>::~SmallArray(&local_148);
          }
          else {
            iVar11 = NULLC::SafeSprintf((char *)pEVar20,(ulong)((iVar22 - iVar11) + errorBufSize),
                                        ")");
            pcVar16 = (char *)((long)(pEVar20->uniqueDependencies).little + (long)iVar11 + -0x30);
          }
          iVar11 = NULLC::SafeSprintf(pcVar16,(ulong)((iVar22 - (int)pcVar16) + errorBufSize),"\n");
          pcVar16 = pcVar16 + iVar11;
        }
        else {
          if (ratings.count <= uVar17) {
            pcVar16 = "T &ArrayView<unsigned int>::operator[](unsigned int) [T = unsigned int]";
            goto LAB_001ee3d7;
          }
          if (ratings.data[uVar17] == bestRating) goto LAB_001edd69;
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 < functions.count);
    }
  }
  pcVar16 = ctx->errorBufLocation;
  sVar13 = strlen(pcVar16);
  pcVar16 = pcVar16 + sVar13;
  ctx->errorBufLocation = pcVar16;
  anon_unknown.dwarf_1117a3::AddErrorInfoWithLocation(ctx,&ctx->errorInfo,source,local_158,pcVar16);
  return;
}

Assistant:

void ReportOnFunctionSelectError(ExpressionContext &ctx, SynBase *source, char* errorBuf, unsigned errorBufSize, const char *messageStart, InplaceStr functionName, ArrayView<FunctionValue> functions, IntrusiveList<TypeHandle> generics, ArrayView<ArgumentData> arguments, ArrayView<unsigned> ratings, unsigned bestRating, bool showInstanceInfo)
{
	assert(errorBuf);

	char *errPos = errorBuf;

	if(!functionName.empty())
	{
		errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "  %.*s", FMT_ISTR(functionName));

		if(!generics.empty())
		{
			errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "<");

			for(TypeHandle *el = generics.head; el; el = el->next)
			{
				errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "%s%.*s", el != generics.head ? ", " : "", FMT_ISTR(el->type->name));
			}

			errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ">(");
		}
		else
		{
			errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "(");
		}

		for(unsigned i = 0; i < arguments.size(); i++)
			errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "%s%.*s", i != 0 ? ", " : "", FMT_ISTR(arguments[i].type->name));

		errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), !functions.empty() ? ")\n" : ")");
	}

	if(!functions.empty())
		errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), bestRating == ~0u ? " the only available are:\n" : " candidates are:\n");

	for(unsigned i = 0; i < functions.size(); i++)
	{
		FunctionData *function = functions[i].function;

		if(!ratings.empty() && ratings[i] != bestRating)
			continue;

		errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "  %.*s %.*s", FMT_ISTR(function->type->returnType->name), FMT_ISTR(function->name->name));

		if(!function->generics.empty())
		{
			errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "<");

			for(unsigned k = 0; k < function->generics.size(); k++)
			{
				MatchData *match = function->generics[k];

				errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "%s%.*s", k != 0 ? ", " : "", FMT_ISTR(match->type->name));
			}

			errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ">");
		}

		errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "(");

		for(unsigned k = 0; k < function->arguments.size(); k++)
		{
			ArgumentData &argument = function->arguments[k];

			errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "%s%s%.*s", k != 0 ? ", " : "", argument.isExplicit ? "explicit " : "", FMT_ISTR(argument.type->name));
		}

		if(ctx.IsGenericFunction(function) && showInstanceInfo)
		{
			TypeBase *parentType = NULL;

			if(functions[i].context->type == ctx.typeAutoRef)
			{
				assert(function->scope->ownerType);
				parentType = function->scope->ownerType;
			}
			else if(function->scope->ownerType)
			{
				parentType = getType<TypeRef>(functions[i].context->type)->subType;
			}

			IntrusiveList<MatchData> aliases;
			SmallArray<CallArgumentData, 16> result(ctx.allocator);

			// Handle named argument order, default argument values and variadic functions
			if(!PrepareArgumentsForFunctionCall(ctx, source, function->arguments, arguments, result, NULL, false) || (functions[i].context->type == ctx.typeAutoRef && !generics.empty()))
			{
				errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ") (wasn't instanced here)");
			}
			else if(TypeFunction *instance = GetGenericFunctionInstanceType(ctx, source, parentType, function, result, aliases))
			{
				GetFunctionRating(ctx, function, instance, result);

				errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ") instanced to\n    %.*s %.*s(", FMT_ISTR(function->type->returnType->name), FMT_ISTR(function->name->name));

				TypeHandle *curr = instance->arguments.head;

				for(unsigned k = 0; k < function->arguments.size(); k++)
				{
					ArgumentData &argument = function->arguments[k];

					errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "%s%s%.*s", k != 0 ? ", " : "", argument.isExplicit ? "explicit " : "", FMT_ISTR(curr->type->name));

					curr = curr->next;
				}

				if(!aliases.empty())
				{
					errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ") with [");

					for(MatchData *curr = aliases.head; curr; curr = curr->next)
						errPos += NULLC::SafeSprintf(errPos, errorBufSize - unsigned(errPos - errorBuf), "%s%.*s = %.*s", curr != aliases.head ? ", " : "", FMT_ISTR(curr->name->name), FMT_ISTR(curr->type->name));

					errPos += NULLC::SafeSprintf(errPos, errorBufSize - unsigned(errPos - errorBuf), "]");
				}
				else
				{
					errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ")");
				}
			}
			else
			{
				errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ") (wasn't instanced here)");
			}
		}
		else
		{
			errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ")");
		}

		errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "\n");
	}

	ctx.errorBufLocation += strlen(ctx.errorBufLocation);

	const char *messageEnd = ctx.errorBufLocation;

	AddErrorInfoWithLocation(ctx, source, messageStart, messageEnd);
}